

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.cpp
# Opt level: O1

int helics::appendMessage(ActionMessage *multiMessage,ActionMessage *newMessage)

{
  ushort uVar1;
  uint uVar2;
  string_view str;
  string local_38;
  
  uVar2 = 0xffffffff;
  if (multiMessage->messageAction == cmd_multi_message) {
    uVar1 = multiMessage->counter;
    if (uVar1 < 0xff) {
      multiMessage->counter = uVar1 + 1;
      ActionMessage::to_string_abi_cxx11_(&local_38,newMessage);
      str._M_str = local_38._M_dataplus._M_p;
      str._M_len = local_38._M_string_length;
      ActionMessage::setString(multiMessage,(uint)uVar1,str);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
      uVar2 = (uint)multiMessage->counter;
    }
  }
  return uVar2;
}

Assistant:

int appendMessage(ActionMessage& multiMessage, const ActionMessage& newMessage)
{
    if (multiMessage.action() == CMD_MULTI_MESSAGE) {
        if (multiMessage.counter < 255) {
            multiMessage.setString(multiMessage.counter++, newMessage.to_string());
            return multiMessage.counter;
        }
    }
    return (-1);
}